

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_all.c
# Opt level: O0

DSA * pkey_get_dsa(EVP_PKEY *key,DSA **dsa)

{
  undefined8 *in_RSI;
  EVP_PKEY *in_RDI;
  DSA *dtmp;
  undefined8 local_8;
  
  if (in_RDI == (EVP_PKEY *)0x0) {
    local_8 = (DSA *)0x0;
  }
  else {
    local_8 = (DSA *)EVP_PKEY_get1_DSA(in_RDI);
    EVP_PKEY_free(in_RDI);
    if (local_8 == (DSA *)0x0) {
      local_8 = (DSA *)0x0;
    }
    else if (in_RSI != (undefined8 *)0x0) {
      DSA_free((DSA *)*in_RSI);
      *in_RSI = local_8;
    }
  }
  return local_8;
}

Assistant:

static DSA *pkey_get_dsa(EVP_PKEY *key, DSA **dsa)
{
    DSA *dtmp;
    if (!key)
        return NULL;
    dtmp = EVP_PKEY_get1_DSA(key);
    EVP_PKEY_free(key);
    if (!dtmp)
        return NULL;
    if (dsa) {
        DSA_free(*dsa);
        *dsa = dtmp;
    }
    return dtmp;
}